

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall
fasttext::DenseMatrix::addVectorToRow(DenseMatrix *this,Vector *vec,int64_t i,real a)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  real *prVar3;
  long in_RDX;
  Vector *in_RDI;
  uint in_XMM0_Da;
  int64_t j;
  real in_stack_ffffffffffffffc8;
  uint uVar4;
  long local_28;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x7f,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  if (in_RDX < (long)(in_RDI->data_).size_) {
    pfVar2 = (float *)Vector::size((Vector *)0x1c5287);
    if (pfVar2 == in_RDI[1].data_.mem_) {
      for (local_28 = 0; local_28 < (long)in_RDI[1].data_.mem_; local_28 = local_28 + 1) {
        uVar4 = in_XMM0_Da;
        prVar3 = Vector::operator[](in_RDI,CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8));
        in_stack_ffffffffffffffc8 = *prVar3;
        pfVar2 = intgemm::AlignedVector<float>::operator[]
                           ((AlignedVector<float> *)&in_RDI[1].data_.size_,
                            in_RDX * (long)in_RDI[1].data_.mem_ + local_28);
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffffc8),ZEXT416(uVar4),
                                 ZEXT416((uint)*pfVar2));
        *pfVar2 = auVar1._0_4_;
      }
      return;
    }
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x81,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0x80,
                "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)")
  ;
}

Assistant:

void DenseMatrix::addVectorToRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec[j];
  }
}